

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O1

ssize_t __thiscall QIODevice::read(QIODevice *this,int __fd,void *__buf,size_t __nbytes)

{
  AccessMode AVar1;
  QIODevicePrivate *this_00;
  QRingBuffer *pQVar2;
  QRingChunk *pQVar3;
  int iVar4;
  ssize_t sVar5;
  char *pcVar6;
  undefined4 in_register_00000034;
  uint uVar7;
  
  this_00 = (QIODevicePrivate *)(this->super_QObject).d_ptr.d;
  uVar7 = (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
          super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  if ((uVar7 & 1) == 0) {
    if (uVar7 == 0) {
      pcVar6 = "device not open";
    }
    else {
      pcVar6 = "WriteOnly device";
    }
  }
  else {
    if (this_00->accessMode == Unset) {
      iVar4 = (*((this_00->super_QObjectPrivate).super_QObjectData.q_ptr)->_vptr_QObject[0xc])();
      this_00->accessMode = RandomAccess - (char)iVar4;
    }
    if ((__buf == (void *)0x1) &&
       ((AVar1 = this_00->accessMode, AVar1 != Sequential || (this_00->transactionStarted == false))
       )) {
      while( true ) {
        pQVar2 = (this_00->buffer).m_buf;
        uVar7 = 0xffffffff;
        if ((pQVar2 != (QRingBuffer *)0x0) && (pQVar2->bufferSize != 0)) {
          pQVar3 = (pQVar2->buffers).d.ptr;
          pcVar6 = (pQVar3->chunk).d.ptr;
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "";
          }
          uVar7 = (uint)(byte)pcVar6[pQVar3->headOffset];
          QRingBuffer::free(pQVar2,(void *)0x1);
        }
        if (uVar7 == 0xffffffff) break;
        if (AVar1 != Sequential) {
          this_00->pos = this_00->pos + 1;
        }
        if (((char)uVar7 != '\r') ||
           (((this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x10) == 0)) {
          *(char *)CONCAT44(in_register_00000034,__fd) = (char)uVar7;
          pQVar2 = (this_00->buffer).m_buf;
          if ((pQVar2 != (QRingBuffer *)0x0) && (pQVar2->bufferSize != 0)) {
            return 1;
          }
          (*(this->super_QObject)._vptr_QObject[0x19])
                    (this,(char *)CONCAT44(in_register_00000034,__fd),0);
          return 1;
        }
      }
    }
    if (-1 < (long)__buf) {
      sVar5 = QIODevicePrivate::read(this_00,__fd,__buf,0);
      return sVar5;
    }
    pcVar6 = "Called with maxSize < 0";
  }
  checkWarnMessage(this,"read",pcVar6);
  return -1;
}

Assistant:

qint64 QIODevice::read(char *data, qint64 maxSize)
{
    Q_D(QIODevice);
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::read(%p, %lld), d->pos = %lld, d->buffer.size() = %lld\n",
           this, data, maxSize, d->pos, d->buffer.size());
#endif

    CHECK_READABLE(read, qint64(-1));
    const bool sequential = d->isSequential();

    // Short-cut for getChar(), unless we need to keep the data in the buffer.
    if (maxSize == 1 && !(sequential && d->transactionStarted)) {
        int chint;
        while ((chint = d->buffer.getChar()) != -1) {
            if (!sequential)
                ++d->pos;

            char c = char(uchar(chint));
            if (c == '\r' && (d->openMode & Text))
                continue;
            *data = c;
#if defined QIODEVICE_DEBUG
            printf("%p \tread 0x%hhx (%c) returning 1 (shortcut)\n", this,
                   int(c), isAsciiPrintable(c) ? c : '?');
#endif
            if (d->buffer.isEmpty())
                readData(data, 0);
            return qint64(1);
        }
    }

    CHECK_MAXLEN(read, qint64(-1));
    const qint64 readBytes = d->read(data, maxSize);

#if defined QIODEVICE_DEBUG
    printf("%p \treturning %lld, d->pos == %lld, d->buffer.size() == %lld\n", this,
           readBytes, d->pos, d->buffer.size());
    if (readBytes > 0)
        debugBinaryString(data - readBytes, readBytes);
#endif

    return readBytes;
}